

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralAction::~IfcStructuralAction(IfcStructuralAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0x58 =
       0x81e7e0;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x40 =
       0x81e8d0;
  *(undefined8 *)&this[-1].super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.field_0xe0 =
       0x81e808;
  this[-1].super_IfcStructuralActivity.super_IfcProduct.Representation.ptr.obj =
       (LazyObject *)0x81e830;
  this[-1].super_IfcStructuralActivity.GlobalOrLocal.field_2._M_allocated_capacity = 0x81e858;
  *(undefined8 *)&this[-1].field_0x158 = 0x81e880;
  *(undefined8 *)&(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject = 0x81e8a8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcStructuralActivity).super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this_00,&PTR_construction_vtable_24__0081e8e8);
  operator_delete(this_00,400);
  return;
}

Assistant:

IfcStructuralAction() : Object("IfcStructuralAction") {}